

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O1

int Abc_NtkRenodeEvalAig(If_Man_t *p,If_Cut_t *pCut)

{
  byte bVar1;
  uint uVar2;
  word *pTruth;
  Vec_Mem_t *pVVar3;
  int iVar4;
  Kit_Graph_t *pGraph;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  word *pwVar8;
  long lVar9;
  
  uVar2 = pCut->iCutFunc;
  if ((int)uVar2 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  bVar1 = pCut->field_0x1f;
  pTruth = p->puTempW;
  pVVar3 = p->vTtMem[bVar1];
  if (pVVar3 == (Vec_Mem_t *)0x0) {
    pwVar8 = (word *)0x0;
  }
  else {
    uVar7 = uVar2 >> 1;
    if (pVVar3->nEntries <= (int)uVar7) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar8 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
             (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
  }
  uVar7 = p->nTruth6Words[bVar1];
  if ((uVar2 & 1) == 0) {
    if (0 < (int)uVar7) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = pwVar8[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
  }
  else if (0 < (int)uVar7) {
    uVar5 = 0;
    do {
      pTruth[uVar5] = ~pwVar8[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  pGraph = Kit_TruthToGraph((uint *)pTruth,(uint)(byte)pCut->field_0x1f,s_vMemory);
  if (pGraph == (Kit_Graph_t *)0x0) {
    iVar6 = 0xfff;
    if (0xffffff < *(uint *)&pCut->field_0x1c) {
      memset(&pCut[1].Area + bVar1,100,(ulong)((*(uint *)&pCut->field_0x1c >> 0x18) - 1) + 1);
    }
  }
  else {
    iVar6 = pGraph->nSize - pGraph->nLeaves;
    if (0xffffff < *(uint *)&pCut->field_0x1c) {
      lVar9 = 0;
      uVar5 = 0;
      do {
        iVar4 = Kit_GraphLeafDepth_rec
                          (pGraph,pGraph->pNodes + (long)pGraph->nSize + -1,
                           (Kit_Node_t *)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar9));
        *(char *)((long)(&pCut[1].Area + bVar1) + uVar5) = (char)iVar4;
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar5 < (byte)pCut->field_0x1f);
    }
    Kit_GraphFree(pGraph);
  }
  return iVar6;
}

Assistant:

int Abc_NtkRenodeEvalAig( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    Kit_Graph_t * pGraph;
    int i, nNodes;
    pGraph = Kit_TruthToGraph( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory );
    if ( pGraph == NULL )
    {
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pPerm[i] = 100;
        return IF_COST_MAX;
    }
    nNodes = Kit_GraphNodeNum( pGraph );
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeLast(pGraph), Kit_GraphNode(pGraph, i) );
    Kit_GraphFree( pGraph );
    return nNodes;
}